

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.hpp
# Opt level: O2

void __thiscall inja::FunctionNode::FunctionNode(FunctionNode *this,Op operation,size_t pos)

{
  uint uVar1;
  
  (this->super_ExpressionNode).super_AstNode.pos = pos;
  (this->super_ExpressionNode).super_AstNode._vptr_AstNode = (_func_int **)&PTR_accept_0019cc08;
  this->operation = operation;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  this->number_args = 1;
  (this->arguments).
  super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->arguments).
  super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->arguments).
  super__Vector_base<std::shared_ptr<inja::ExpressionNode>,_std::allocator<std::shared_ptr<inja::ExpressionNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&(this->callback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->callback).super__Function_base._M_functor + 8) = 0;
  (this->callback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->callback)._M_invoker = (_Invoker_type)0x0;
  uVar1 = 4;
  switch(operation) {
  case Not:
    break;
  case And:
  case Or:
    this->number_args = 2;
  default:
    operation = Left;
    uVar1 = 1;
    break;
  case In:
  case Equal:
  case NotEqual:
  case Greater:
  case GreaterEqual:
  case Less:
  case LessEqual:
    this->number_args = 2;
    operation = Left;
    uVar1 = 2;
    break;
  case Add:
  case Subtract:
    this->number_args = 2;
    operation = Left;
    uVar1 = 3;
    break;
  case Multiplication:
  case Division:
  case Modulo:
    this->number_args = 2;
    operation = Left;
    break;
  case Power:
    this->number_args = 2;
    operation = Right;
    uVar1 = 5;
    break;
  case AtId:
    this->number_args = 2;
    operation = Left;
    uVar1 = 8;
  }
  this->precedence = uVar1;
  this->associativity = operation;
  return;
}

Assistant:

AstNode(size_t pos): pos(pos) {}